

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O3

int RSA_private_encrypt(int flen,uchar *from,uchar *to,RSA *rsa,int padding)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_0000003c;
  size_t out_len;
  ulong local_30;
  
  uVar1 = RSA_size(rsa);
  iVar2 = RSA_sign_raw((RSA *)rsa,&local_30,to,(ulong)uVar1,from,CONCAT44(in_register_0000003c,flen)
                       ,padding);
  iVar3 = -1;
  if (iVar2 != 0) {
    if ((local_30 & 0xffffffff80000000) == 0) {
      iVar3 = (int)local_30;
    }
    else {
      ERR_put_error(4,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0x14e);
    }
  }
  return iVar3;
}

Assistant:

int RSA_private_encrypt(size_t flen, const uint8_t *from, uint8_t *to, RSA *rsa,
                        int padding) {
  size_t out_len;

  if (!RSA_sign_raw(rsa, &out_len, to, RSA_size(rsa), from, flen, padding)) {
    return -1;
  }

  if (out_len > INT_MAX) {
    OPENSSL_PUT_ERROR(RSA, ERR_R_OVERFLOW);
    return -1;
  }
  return (int)out_len;
}